

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void CountTest<uttt::IBoard>(int depth)

{
  ostream *poVar1;
  longlong lVar2;
  int in_EDI;
  longlong count;
  longlong millis;
  time_point t2;
  longlong r;
  time_point t1;
  int i;
  int in_stack_000000fc;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff98;
  type in_stack_ffffffffffffffa0;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
  in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  int depth_00;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  rep local_28;
  undefined8 local_20;
  longlong local_18;
  undefined8 local_10;
  int local_8;
  int local_4;
  
  local_4 = in_EDI;
  for (local_8 = 0; depth_00 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20), local_8 < local_4;
      local_8 = local_8 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Working on depth: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8 + 1);
    std::operator<<(poVar1,'\n');
    local_10 = std::chrono::_V2::system_clock::now();
    local_18 = game::Count<uttt::IBoard>(depth_00);
    local_20 = std::chrono::_V2::system_clock::now();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffffa8.__r,
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffffa0.__r);
    local_30.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  (in_stack_ffffffffffffff98);
    local_28 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_30);
    poVar1 = std::operator<<((ostream *)&std::cout,"Count: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    std::operator<<(poVar1,'\n');
    poVar1 = std::operator<<((ostream *)&std::cout,"Duration: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28 / 1000);
    poVar1 = std::operator<<(poVar1," seconds ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28 % 1000);
    std::operator<<(poVar1," milliseconds\n");
    local_10 = std::chrono::_V2::system_clock::now();
    lVar2 = game::CountBFS<uttt::IBoard>(in_stack_000000fc);
    in_stack_ffffffffffffffb0 = std::chrono::_V2::system_clock::now();
    local_20 = in_stack_ffffffffffffffb0;
    poVar1 = std::operator<<((ostream *)&std::cout,"DFS count: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,lVar2);
    std::operator<<(poVar1,'\n');
    in_stack_ffffffffffffffa0 =
         std::chrono::operator-(in_stack_ffffffffffffffa8.__r,in_stack_ffffffffffffffa0.__r);
    in_stack_ffffffffffffffa8 =
         std::chrono::
         duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                   (in_stack_ffffffffffffff98);
    local_28 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                         ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xffffffffffffffa8);
    poVar1 = std::operator<<((ostream *)&std::cout,"Duration: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28 / 1000);
    poVar1 = std::operator<<(poVar1," seconds ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28 % 1000);
    std::operator<<(poVar1," milliseconds\n");
  }
  return;
}

Assistant:

void
CountTest(int depth)
{
    for (int i = 0; i < depth; ++i)
    {
        std::cout << "Working on depth: " << i + 1 << '\n';

        auto t1 = std::chrono::high_resolution_clock::now();
        auto r = game::Count<IGame>(i);
        auto t2 = std::chrono::high_resolution_clock::now();
        long long millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        std::cout << "Count: " << r << '\n';
        std::cout << "Duration: " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds\n";

        t1 = std::chrono::high_resolution_clock::now();
        auto count = game::CountBFS<IGame>(i);
        t2 = std::chrono::high_resolution_clock::now();
        std::cout << "DFS count: " << count << '\n';
        millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        std::cout << "Duration: " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds\n";
    }
}